

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O1

Maybe<capnp::compiler::Compiler::Node::Content_&> __thiscall
capnp::compiler::Compiler::Node::getContent(Node *this,State minimumState)

{
  void **ppvVar1;
  void **ppvVar2;
  Arena *pAVar3;
  int iVar4;
  _func_int **pp_Var5;
  void *pvVar6;
  Module *pMVar7;
  _func_int **pp_Var8;
  long *plVar9;
  WirePointer *pWVar10;
  undefined8 uVar11;
  undefined8 *puVar12;
  uint64_t uVar13;
  char *pcVar14;
  StringPtr value;
  Reader *pRVar15;
  char cVar16;
  ushort uVar17;
  Node *pNVar18;
  ulong uVar19;
  ulong uVar20;
  NodeTranslator *pNVar21;
  Schema SVar22;
  undefined1 *ptr;
  int in_EDX;
  ulong uVar23;
  long lVar24;
  undefined4 in_register_00000034;
  CompiledModule *parent;
  size_t sVar25;
  ElementCount EVar26;
  long *plVar27;
  Reader *auxNode;
  Reader *pRVar28;
  Alias *ptrCopy;
  ArrayPtr<const_char> AVar29;
  Reader value_00;
  NodeSet local_5e0;
  _Rb_tree<kj::StringPtr,std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Alias,decltype(nullptr)>>,std::_Select1st<std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Alias,decltype(nullptr)>>>,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Alias,decltype(nullptr)>>>>
  *local_580;
  void **local_578;
  _Rb_tree<kj::StringPtr,std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Node,decltype(nullptr)>>,std::_Select1st<std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Node,decltype(nullptr)>>>,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Node,decltype(nullptr)>>>>
  *local_570;
  BuilderFor<capnp::schema::Node> builder;
  Orphan<capnp::schema::Node> schemaNode;
  DebugExpression<bool> _kjCondition;
  undefined7 uStack_51f;
  CompiledModule *pCStack_518;
  WirePointer *local_510;
  int iStack_508;
  undefined4 uStack_504;
  uint local_500;
  ushort uStack_4fc;
  undefined2 uStack_4fa;
  int iStack_4f8;
  undefined4 uStack_4f4;
  WirePointer *local_4f0;
  size_t sStack_4e8;
  undefined4 local_4e0;
  undefined4 uStack_4dc;
  Reader *pRStack_4d8;
  char *local_4d0;
  ArrayDisposer *pAStack_4c8;
  Fault f_1;
  CompiledModule *pCStack_380;
  WirePointer *local_378;
  Node *pNStack_370;
  StructDataBitCount local_368;
  StructPointerCount SStack_364;
  undefined2 uStack_362;
  int iStack_360;
  undefined4 uStack_35c;
  Fault f;
  SegmentBuilder *pSStack_1f0;
  undefined4 local_1e8;
  undefined4 uStack_1e4;
  ElementCount EStack_1e0;
  StructPointerCount SStack_1d4;
  undefined8 local_1b8;
  Builder nestedNodes;
  
  parent = (CompiledModule *)CONCAT44(in_register_00000034,minimumState);
  cVar16 = *(char *)((parent->contentArena).super_MessageBuilder.arenaSpace + 10);
  __kjCondition = (Exception *)(CONCAT71(uStack_51f,cVar16) ^ 1);
  if (cVar16 != '\0') {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[45]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/compiler.c++"
               ,0x1ce,FAILED,"!isBuiltin",
               "_kjCondition,\"illegal method call for built-in declaration\"",&_kjCondition,
               (char (*) [45])"illegal method call for built-in declaration");
    kj::_::Debug::Fault::fatal(&f);
  }
  ppvVar1 = (parent->contentArena).super_MessageBuilder.arenaSpace + 0xc;
  iVar4 = *(int *)((parent->contentArena).super_MessageBuilder.arenaSpace + 0xc);
  if (in_EDX <= iVar4) {
    (this->super_Resolver)._vptr_Resolver = (_func_int **)ppvVar1;
    return (Maybe<capnp::compiler::Compiler::Node::Content_&>)(Content *)this;
  }
  if ((char)(parent->rootNode).kind == USING) {
    pp_Var5 = parent->parserModule[1].super_ErrorReporter._vptr_ErrorReporter;
    (**(code **)*pp_Var5)
              (pp_Var5,*(undefined4 *)
                        ((long)(parent->contentArena).super_MessageBuilder.arenaSpace + 0x54),
               *(undefined4 *)((parent->contentArena).super_MessageBuilder.arenaSpace + 0xb),
               "Declaration recursively depends on itself.",0x2b);
    (this->super_Resolver)._vptr_Resolver = (_func_int **)0x0;
    return (Maybe<capnp::compiler::Compiler::Node::Content_&>)(Content *)this;
  }
  *(undefined1 *)&(parent->rootNode).kind = USING;
  if (iVar4 != 2) {
    if (iVar4 != 1) {
      if ((iVar4 != 0) || (in_EDX < 1)) goto LAB_0011791e;
      if (*(ushort *)((long)(parent->contentArena).super_MessageBuilder.arenaSpace + 0x24) < 3) {
        iStack_508 = 0x7fffffff;
        pCStack_518 = (CompiledModule *)0x0;
        local_510 = (WirePointer *)0x0;
        __kjCondition = (Exception *)0x0;
      }
      else {
        __kjCondition = (Exception *)(parent->contentArena).super_MessageBuilder.arenaSpace[0];
        pCStack_518 = (CompiledModule *)(parent->contentArena).super_MessageBuilder.arenaSpace[1];
        local_510 = (WirePointer *)
                    ((long)(parent->contentArena).super_MessageBuilder.arenaSpace[3] + 0x10);
        iStack_508 = *(int *)((parent->contentArena).super_MessageBuilder.arenaSpace + 5);
      }
      pp_Var5 = (parent->parserModule->super_ErrorReporter)._vptr_ErrorReporter;
      capnp::_::PointerReader::getList
                ((ListReader *)&f,(PointerReader *)&_kjCondition,INLINE_COMPOSITE,(word *)0x0);
      if (EStack_1e0 != 0) {
        pAVar3 = (Arena *)(pp_Var5 + 2);
        local_580 = (_Rb_tree<kj::StringPtr,std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Alias,decltype(nullptr)>>,std::_Select1st<std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Alias,decltype(nullptr)>>>,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Alias,decltype(nullptr)>>>>
                     *)&(parent->contentArena).allocationStrategy;
        local_578 = (parent->contentArena).super_MessageBuilder.arenaSpace + 0x13;
        local_570 = (_Rb_tree<kj::StringPtr,std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Node,decltype(nullptr)>>,std::_Select1st<std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Node,decltype(nullptr)>>>,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Node,decltype(nullptr)>>>>
                     *)((parent->contentArena).super_MessageBuilder.arenaSpace + 0xd);
        EVar26 = 0;
        do {
          capnp::_::ListReader::getStructElement
                    ((StructReader *)&_kjCondition,(ListReader *)&f,EVar26);
          if (local_500 < 0x20) {
            uVar17 = 0;
          }
          else {
            uVar17 = *(ushort *)((long)&(local_510->offsetAndKind).value + 2);
          }
          if (0xd < uVar17) {
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,char_const(&)[25],capnp::compiler::Declaration::Reader&>
                      (&f_1,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/compiler.c++"
                       ,0x205,FAILED,(char *)0x0,"\"unknown declaration type\", nestedDecl",
                       (char (*) [25])"unknown declaration type",(Reader *)&_kjCondition);
            kj::_::Debug::Fault::fatal(&f_1);
          }
          if ((0x35d0U >> (uVar17 & 0x1f) & 1) == 0) {
            if ((0xa2dU >> (uVar17 & 0x1f) & 1) == 0) {
              if (uStack_4fc < 6) {
                local_5e0.node._reader.pointers._0_4_ = 0x7fffffff;
                local_5e0.node._reader.capTable = (CapTableReader *)0x0;
                local_5e0.node._reader.data = (void *)0x0;
                local_5e0.node._reader.segment = (SegmentReader *)0x0;
              }
              else {
                local_5e0.node._reader.data = (void *)(CONCAT44(uStack_504,iStack_508) + 0x28);
                local_5e0.node._reader.capTable = (CapTableReader *)pCStack_518;
                local_5e0.node._reader.segment = (SegmentReader *)__kjCondition;
                local_5e0.node._reader.pointers._0_4_ = iStack_4f8;
              }
              pMVar7 = parent->parserModule;
              capnp::_::PointerReader::getStruct
                        ((StructReader *)&f_1,(PointerReader *)&local_5e0,(word *)0x0);
              pNVar18 = (Node *)kj::Arena::allocateBytes(pAVar3,0xd8,8,false);
              (pNVar18->super_Resolver)._vptr_Resolver = (_func_int **)pMVar7;
              pNVar18->module = parent;
              (pNVar18->parent).ptr = (Node *)f_1.exception;
              (pNVar18->declaration)._reader.segment = (SegmentReader *)pCStack_380;
              (pNVar18->declaration)._reader.capTable = (CapTableReader *)local_378;
              (pNVar18->declaration)._reader.data = pNStack_370;
              (pNVar18->declaration)._reader.pointers =
                   (WirePointer *)CONCAT26(uStack_362,CONCAT24(SStack_364,local_368));
              (pNVar18->declaration)._reader.dataSize = iStack_360;
              (pNVar18->declaration)._reader.pointerCount = (short)uStack_35c;
              *(short *)&(pNVar18->declaration)._reader.field_0x26 = SUB42(uStack_35c,2);
              *(undefined1 *)&(pNVar18->declaration)._reader.nestingLimit = 0;
              (pNVar18->guardedContent).orderedNestedNodes.builder.ptr = (Node **)0x0;
              (pNVar18->guardedContent).orderedNestedNodes.builder.pos =
                   (RemoveConst<capnp::compiler::Compiler::Node_*> *)0x0;
              (pNVar18->guardedContent).orderedNestedNodes.builder.endPtr = (Node **)0x0;
              (pNVar18->guardedContent).orderedNestedNodes.builder.disposer = (ArrayDisposer *)0x0;
              *(undefined1 *)&(pNVar18->guardedContent).aliases._M_t._M_impl = 0;
              if (uStack_4fc == 0) {
                local_5e0.node._reader.pointers._0_4_ = 0x7fffffff;
                local_5e0.node._reader.capTable = (CapTableReader *)0x0;
                local_5e0.node._reader.data = (void *)0x0;
                local_5e0.node._reader.segment = (SegmentReader *)0x0;
              }
              else {
                local_5e0.node._reader.data = (void *)CONCAT44(uStack_504,iStack_508);
                local_5e0.node._reader.capTable = (CapTableReader *)pCStack_518;
                local_5e0.node._reader.segment = (SegmentReader *)__kjCondition;
                local_5e0.node._reader.pointers._0_4_ = iStack_4f8;
              }
              capnp::_::PointerReader::getStruct
                        ((StructReader *)&f_1,(PointerReader *)&local_5e0,(word *)0x0);
              if (SStack_364 == 0) {
                local_5e0.node._reader.pointers._0_4_ = 0x7fffffff;
                local_5e0.node._reader.capTable = (CapTableReader *)0x0;
                pNStack_370 = (Node *)0x0;
                local_5e0.node._reader.segment = (SegmentReader *)0x0;
              }
              else {
                local_5e0.node._reader.capTable = (CapTableReader *)pCStack_380;
                local_5e0.node._reader.segment = (SegmentReader *)f_1.exception;
                local_5e0.node._reader.pointers._0_4_ = iStack_360;
              }
              local_5e0.node._reader.data = pNStack_370;
              _f_1 = (ArrayPtr<const_char>)
                     capnp::_::PointerReader::getBlob<capnp::Text>
                               ((PointerReader *)&local_5e0,(void *)0x0,0);
              local_378 = (WirePointer *)
                          &kj::DestructorOnlyDisposer<capnp::compiler::Compiler::Alias>::instance;
              std::
              _Rb_tree<kj::StringPtr,std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Alias,decltype(nullptr)>>,std::_Select1st<std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Alias,decltype(nullptr)>>>,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Alias,decltype(nullptr)>>>>
              ::
              _M_emplace_equal<std::pair<kj::StringPtr,kj::Own<capnp::compiler::Compiler::Alias,decltype(nullptr)>>>
                        (local_580,
                         (pair<kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Alias,_std::nullptr_t>_>
                          *)&f_1);
              pNStack_370 = pNVar18;
              if (pNVar18 != (Node *)0x0) {
                pNStack_370 = (Node *)0x0;
                kj::DestructorOnlyDisposer<capnp::compiler::Compiler::Alias>::disposeImpl
                          ((DestructorOnlyDisposer<capnp::compiler::Compiler::Alias> *)
                           &kj::DestructorOnlyDisposer<capnp::compiler::Compiler::Alias>::instance,
                           pNVar18);
              }
            }
            else {
              pNVar18 = (Node *)kj::Arena::allocateBytes(pAVar3,0x1c0,8,false);
              Node(pNVar18,(Node *)parent,(Reader *)&_kjCondition);
              if (uStack_4fc == 0) {
                local_5e0.node._reader.pointers._0_4_ = 0x7fffffff;
                local_5e0.node._reader.capTable = (CapTableReader *)0x0;
                local_5e0.node._reader.data = (void *)0x0;
                local_5e0.node._reader.segment = (SegmentReader *)0x0;
              }
              else {
                local_5e0.node._reader.data = (void *)CONCAT44(uStack_504,iStack_508);
                local_5e0.node._reader.capTable = (CapTableReader *)pCStack_518;
                local_5e0.node._reader.segment = (SegmentReader *)__kjCondition;
                local_5e0.node._reader.pointers._0_4_ = iStack_4f8;
              }
              capnp::_::PointerReader::getStruct
                        ((StructReader *)&f_1,(PointerReader *)&local_5e0,(word *)0x0);
              if (SStack_364 == 0) {
                local_5e0.node._reader.pointers._0_4_ = 0x7fffffff;
                local_5e0.node._reader.capTable = (CapTableReader *)0x0;
                pNStack_370 = (Node *)0x0;
                local_5e0.node._reader.segment = (SegmentReader *)0x0;
              }
              else {
                local_5e0.node._reader.capTable = (CapTableReader *)pCStack_380;
                local_5e0.node._reader.segment = (SegmentReader *)f_1.exception;
                local_5e0.node._reader.pointers._0_4_ = iStack_360;
              }
              local_5e0.node._reader.data = pNStack_370;
              AVar29 = (ArrayPtr<const_char>)
                       capnp::_::PointerReader::getBlob<capnp::Text>
                                 ((PointerReader *)&local_5e0,(void *)0x0,0);
              pvVar6 = (parent->contentArena).super_MessageBuilder.arenaSpace[0x15];
              if ((parent->contentArena).super_MessageBuilder.arenaSpace[0x14] == pvVar6) {
                sVar25 = (long)pvVar6 - (long)*local_578 >> 2;
                if (pvVar6 == *local_578) {
                  sVar25 = 4;
                }
                kj::Vector<capnp::compiler::Compiler::Node_*>::setCapacity
                          ((Vector<capnp::compiler::Compiler::Node_*> *)local_578,sVar25);
              }
              *(Node **)(parent->contentArena).super_MessageBuilder.arenaSpace[0x14] = pNVar18;
              ppvVar2 = (parent->contentArena).super_MessageBuilder.arenaSpace + 0x14;
              *ppvVar2 = (void *)((long)*ppvVar2 + 8);
              local_378 = (WirePointer *)
                          &kj::DestructorOnlyDisposer<capnp::compiler::Compiler::Node>::instance;
              _f_1 = AVar29;
              std::
              _Rb_tree<kj::StringPtr,std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Node,decltype(nullptr)>>,std::_Select1st<std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Node,decltype(nullptr)>>>,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Node,decltype(nullptr)>>>>
              ::
              _M_emplace_equal<std::pair<kj::StringPtr,kj::Own<capnp::compiler::Compiler::Node,decltype(nullptr)>>>
                        (local_570,
                         (pair<kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Node,_std::nullptr_t>_>
                          *)&f_1);
              pNStack_370 = pNVar18;
              if (pNVar18 != (Node *)0x0) {
                pNStack_370 = (Node *)0x0;
                kj::DestructorOnlyDisposer<capnp::compiler::Compiler::Node>::disposeImpl
                          ((DestructorOnlyDisposer<capnp::compiler::Compiler::Node> *)
                           &kj::DestructorOnlyDisposer<capnp::compiler::Compiler::Node>::instance,
                           (pNVar18->super_Resolver)._vptr_Resolver[-2] +
                           (long)&(pNVar18->super_Resolver)._vptr_Resolver);
              }
            }
          }
          EVar26 = EVar26 + 1;
        } while (EStack_1e0 != EVar26);
      }
      *(undefined4 *)ppvVar1 = 1;
    }
    if (in_EDX < 2) goto LAB_0011791e;
    pp_Var5 = (parent->parserModule->super_ErrorReporter)._vptr_ErrorReporter;
    capnp::_::OrphanBuilder::initStruct
              ((OrphanBuilder *)&f,(BuilderArena *)pp_Var5[0x2b],(CapTableBuilder *)pp_Var5[0x2c],
               (StructSize)0x60006);
    schemaNode.builder.capTable._0_4_ = local_1e8;
    schemaNode.builder.capTable._4_4_ = uStack_1e4;
    schemaNode.builder.tag.content = (uint64_t)f.exception;
    schemaNode.builder.segment = pSStack_1f0;
    capnp::_::OrphanBuilder::asStruct(&builder._builder,&schemaNode.builder,(StructSize)0x60006);
    *(void **)builder._builder.data = (parent->contentArena).super_MessageBuilder.arenaSpace[6];
    value.content.ptr = (char *)(parent->contentArena).super_MessageBuilder.arenaSpace[7];
    value.content.size_ = (size_t)(parent->contentArena).super_MessageBuilder.arenaSpace[8];
    f.exception = (Exception *)builder._builder.segment;
    capnp::_::PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&f,(Reader)value.content);
    pvVar6 = (parent->contentArena).super_MessageBuilder.arenaSpace[7];
    uVar19 = (long)(parent->contentArena).super_MessageBuilder.arenaSpace[8] - 1;
    uVar20 = uVar19;
    do {
      uVar23 = uVar20;
      if (uVar23 == 0) break;
      uVar20 = uVar23 - 1;
    } while (*(char *)((long)pvVar6 + (uVar23 - 1)) != '.');
    if (uVar23 != 0) {
      *(int *)((long)builder._builder.data + 8) = (int)(uVar23 - 1) + 1;
    }
    do {
      uVar20 = uVar19;
      uVar19 = uVar20 - 1;
      if (uVar20 == 0) break;
    } while (*(char *)((long)pvVar6 + (uVar20 - 1)) != ':');
    if ((uVar20 != 0) && (*(uint *)((long)builder._builder.data + 8) < uVar19)) {
      *(int *)((long)builder._builder.data + 8) = (int)uVar19 + 1;
    }
    pp_Var8 = (parent->contentArena).super_MessageBuilder._vptr_MessageBuilder;
    if (pp_Var8 != (_func_int **)0x0) {
      *(_func_int **)((long)builder._builder.data + 0x10) = pp_Var8[9];
    }
    f.exception = (Exception *)builder._builder.segment;
    capnp::_::PointerBuilder::initStructList
              (&nestedNodes.builder,(PointerBuilder *)&f,
               (ElementCount)
               ((ulong)((long)(parent->contentArena).super_MessageBuilder.arenaSpace[0x14] -
                       (long)(parent->contentArena).super_MessageBuilder.arenaSpace[0x13]) >> 3),
               (StructSize)0x10001);
    plVar27 = (long *)(parent->contentArena).super_MessageBuilder.arenaSpace[0x13];
    plVar9 = (long *)(parent->contentArena).super_MessageBuilder.arenaSpace[0x14];
    if (plVar27 != plVar9) {
      EVar26 = 0;
      do {
        lVar24 = *plVar27;
        capnp::_::ListBuilder::getStructElement
                  ((StructBuilder *)&_kjCondition,&nestedNodes.builder,EVar26);
        if (*(short *)(lVar24 + 0x3c) == 0) {
          f_1.exception = (Exception *)0x0;
        }
        else {
          f_1.exception = *(Exception **)(lVar24 + 0x18);
        }
        capnp::_::PointerReader::getStruct((StructReader *)&f,(PointerReader *)&f_1,(word *)0x0);
        f_1 = f;
        if (SStack_1d4 == 0) {
          f_1.exception = (Exception *)0x0;
        }
        value_00 = capnp::_::PointerReader::getBlob<capnp::Text>
                             ((PointerReader *)&f_1,(void *)0x0,0);
        pCStack_380 = pCStack_518;
        f_1.exception = __kjCondition;
        capnp::_::PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&f_1,value_00);
        capnp::_::ListBuilder::getStructElement((StructBuilder *)&f,&nestedNodes.builder,EVar26);
        builder._builder.pointers[1] = *(WirePointer *)(lVar24 + 0x48);
        EVar26 = EVar26 + 1;
        plVar27 = plVar27 + 1;
      } while (plVar27 != plVar9);
    }
    pAVar3 = (Arena *)(pp_Var5 + 0x2d);
    f.exception._0_1_ =
         *(int *)((parent->parserModule->super_ErrorReporter)._vptr_ErrorReporter + 1) == 0;
    pNVar21 = kj::Arena::
              allocate<capnp::compiler::NodeTranslator,capnp::compiler::Compiler::Node&,capnp::compiler::ErrorReporter&,capnp::compiler::Declaration::Reader&,capnp::Orphan<capnp::schema::Node>,bool>
                        (pAVar3,(Node *)parent,
                         (ErrorReporter *)
                         parent->parserModule[1].super_ErrorReporter._vptr_ErrorReporter,
                         (Reader *)(parent->contentArena).super_MessageBuilder.arenaSpace,
                         &schemaNode,(bool *)&f);
    (parent->content).builder.tag.content = (uint64_t)pNVar21;
    NodeTranslator::getBootstrapNode(&local_5e0,pNVar21);
    if (local_5e0.auxNodes.size_ != 0) {
      lVar24 = local_5e0.auxNodes.size_ * 0x30;
      pRVar28 = local_5e0.auxNodes.ptr;
      do {
        SchemaLoader::loadOnce((SchemaLoader *)(pp_Var5 + 0x31),pRVar28);
        pRVar28 = pRVar28 + 1;
        lVar24 = lVar24 + -0x30;
      } while (lVar24 != 0);
    }
    SVar22 = SchemaLoader::loadOnce((SchemaLoader *)(pp_Var5 + 0x31),&local_5e0.node);
    sVar25 = local_5e0.sourceInfo.size_;
    pRVar15 = local_5e0.sourceInfo.ptr;
    if (*(char *)&(parent->content).builder.segment == '\x01') {
      *(undefined1 *)&(parent->content).builder.segment = 0;
    }
    (parent->content).builder.capTable = (CapTableBuilder *)SVar22.raw;
    *(undefined1 *)&(parent->content).builder.segment = 1;
    if (local_5e0.sourceInfo.ptr != (Reader *)0x0) {
      local_5e0.sourceInfo.ptr = (Reader *)0x0;
      local_5e0.sourceInfo.size_ = 0;
      (*(code *)**(undefined8 **)local_5e0.sourceInfo.disposer)
                (local_5e0.sourceInfo.disposer,pRVar15,0x30,sVar25,sVar25,0);
    }
    sVar25 = local_5e0.auxNodes.size_;
    pRVar28 = local_5e0.auxNodes.ptr;
    if (local_5e0.auxNodes.ptr != (Reader *)0x0) {
      local_5e0.auxNodes.ptr = (Reader *)0x0;
      local_5e0.auxNodes.size_ = 0;
      (*(code *)**(undefined8 **)local_5e0.auxNodes.disposer)
                (local_5e0.auxNodes.disposer,pRVar28,0x30,sVar25,sVar25,0);
    }
    __kjCondition = __kjCondition & 0xffffffffffffff00;
    f.exception = f.exception & 0xffffffffffffff00;
    ptr = (undefined1 *)kj::Arena::allocateBytes(pAVar3,0x10,8,true);
    *ptr = 1;
    *(void ***)(ptr + 8) = ppvVar1;
    kj::Arena::setDestructor
              (pAVar3,ptr,
               kj::Arena::
               destroyObject<kj::_::Deferred<capnp::compiler::Compiler::Node::getContent(capnp::compiler::Compiler::Node::Content::State)::__2>>
              );
    *(undefined4 *)ppvVar1 = 2;
    if (schemaNode.builder.segment != (SegmentBuilder *)0x0) {
      capnp::_::OrphanBuilder::euthanize(&schemaNode.builder);
    }
  }
  if (2 < in_EDX) {
    f.exception = (Exception *)0x0;
    if (*(char *)&(parent->content).builder.segment == '\0') {
      cVar16 = (**(code **)(*parent->parserModule[1].super_ErrorReporter._vptr_ErrorReporter + 8))()
      ;
      f_1.exception._0_1_ = cVar16;
      if (cVar16 == '\0') {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
                  ((Fault *)&_kjCondition,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/compiler.c++"
                   ,0x253,FAILED,"module->getErrorReporter().hadErrors()","_kjCondition,",
                   (DebugExpression<bool> *)&f_1);
        kj::_::Debug::Fault::fatal((Fault *)&_kjCondition);
      }
      NodeTranslator::getBootstrapNode
                ((NodeSet *)&_kjCondition,(NodeTranslator *)(parent->content).builder.tag.content);
    }
    else {
      pNVar21 = (NodeTranslator *)(parent->content).builder.tag.content;
      SVar22 = SchemaLoader::getUnbound
                         ((SchemaLoader *)
                          ((parent->parserModule->super_ErrorReporter)._vptr_ErrorReporter + 0x31),
                          (uint64_t)(parent->contentArena).super_MessageBuilder.arenaSpace[6]);
      NodeTranslator::finish((NodeSet *)&_kjCondition,pNVar21,SVar22);
    }
    local_1b8 = CONCAT44(uStack_4dc,local_4e0);
    if (*(char *)&(parent->content).builder.location == '\x01') {
      *(undefined1 *)&(parent->content).builder.location = 0;
    }
    local_1e8 = SUB84(local_510,0);
    uStack_1e4 = (undefined4)((ulong)local_510 >> 0x20);
    *(uint *)&(parent->rootNode).declaration._reader.capTable = local_500;
    *(uint *)((long)&(parent->rootNode).declaration._reader.capTable + 4) =
         CONCAT22(uStack_4fa,uStack_4fc);
    *(int *)&(parent->rootNode).declaration._reader.data = iStack_4f8;
    *(undefined4 *)((long)&(parent->rootNode).declaration._reader.data + 4) = uStack_4f4;
    *(undefined4 *)&(parent->rootNode).parent.ptr = local_1e8;
    *(undefined4 *)((long)&(parent->rootNode).parent.ptr + 4) = uStack_1e4;
    *(int *)&(parent->rootNode).declaration._reader.segment = iStack_508;
    *(undefined4 *)((long)&(parent->rootNode).declaration._reader.segment + 4) = uStack_504;
    (parent->rootNode).super_Resolver._vptr_Resolver = (_func_int **)__kjCondition;
    (parent->rootNode).module = pCStack_518;
    *(undefined1 *)&(parent->content).builder.location = 1;
    pWVar10 = (parent->rootNode).declaration._reader.pointers;
    f.exception = __kjCondition;
    if (pWVar10 != (WirePointer *)0x0) {
      uVar11._0_4_ = (parent->rootNode).declaration._reader.dataSize;
      uVar11._4_2_ = (parent->rootNode).declaration._reader.pointerCount;
      uVar11._6_2_ = *(undefined2 *)&(parent->rootNode).declaration._reader.field_0x26;
      (parent->rootNode).declaration._reader.pointers = (WirePointer *)0x0;
      (parent->rootNode).declaration._reader.dataSize = 0;
      (parent->rootNode).declaration._reader.pointerCount = 0;
      *(undefined2 *)&(parent->rootNode).declaration._reader.field_0x26 = 0;
      puVar12 = *(undefined8 **)&(parent->rootNode).declaration._reader.nestingLimit;
      (**(code **)*puVar12)(puVar12,pWVar10,0x30,uVar11,uVar11,0);
    }
    (parent->rootNode).declaration._reader.pointers = local_4f0;
    (parent->rootNode).declaration._reader.dataSize = (undefined4)sStack_4e8;
    (parent->rootNode).declaration._reader.pointerCount = sStack_4e8._4_2_;
    *(undefined2 *)&(parent->rootNode).declaration._reader.field_0x26 = sStack_4e8._6_2_;
    *(undefined8 *)&(parent->rootNode).declaration._reader.nestingLimit = local_1b8;
    uVar13 = (parent->rootNode).id;
    if (uVar13 != 0) {
      pcVar14 = (parent->rootNode).displayName.content.ptr;
      (parent->rootNode).id = 0;
      (parent->rootNode).displayName.content.ptr = (char *)0x0;
      puVar12 = (undefined8 *)(parent->rootNode).displayName.content.size_;
      (**(code **)*puVar12)(puVar12,uVar13,0x30,pcVar14,pcVar14,0);
    }
    (parent->rootNode).id = (uint64_t)pRStack_4d8;
    (parent->rootNode).displayName.content.ptr = local_4d0;
    (parent->rootNode).displayName.content.size_ = (size_t)pAStack_4c8;
    *(undefined4 *)((parent->contentArena).super_MessageBuilder.arenaSpace + 0xc) = 3;
  }
LAB_0011791e:
  (this->super_Resolver)._vptr_Resolver = (_func_int **)ppvVar1;
  *(undefined1 *)&(parent->rootNode).kind = FILE;
  return (Maybe<capnp::compiler::Compiler::Node::Content_&>)(Content *)this;
}

Assistant:

kj::Maybe<Compiler::Node::Content&> Compiler::Node::getContent(Content::State minimumState) {
  KJ_REQUIRE(!isBuiltin, "illegal method call for built-in declaration");

  auto& content = guardedContent;

  if (content.stateHasReached(minimumState)) {
    return content;
  }

  if (inGetContent) {
    addError("Declaration recursively depends on itself.");
    return kj::none;
  }

  inGetContent = true;
  KJ_DEFER(inGetContent = false);

  switch (content.state) {
    case Content::STUB: {
      if (minimumState <= Content::STUB) break;

      // Expand the child nodes.
      auto& arena = module->getCompiler().getNodeArena();

      for (auto nestedDecl: declaration.getNestedDecls()) {
        switch (nestedDecl.which()) {
          case Declaration::FILE:
          case Declaration::CONST:
          case Declaration::ANNOTATION:
          case Declaration::ENUM:
          case Declaration::STRUCT:
          case Declaration::INTERFACE: {
            kj::Own<Node> subNode = arena.allocateOwn<Node>(*this, nestedDecl);
            kj::StringPtr name = nestedDecl.getName().getValue();
            content.orderedNestedNodes.add(subNode);
            content.nestedNodes.insert(std::make_pair(name, kj::mv(subNode)));
            break;
          }

          case Declaration::USING: {
            kj::Own<Alias> alias = arena.allocateOwn<Alias>(
                *module, *this, nestedDecl.getUsing().getTarget());
            kj::StringPtr name = nestedDecl.getName().getValue();
            content.aliases.insert(std::make_pair(name, kj::mv(alias)));
            break;
          }
          case Declaration::ENUMERANT:
          case Declaration::FIELD:
          case Declaration::UNION:
          case Declaration::GROUP:
          case Declaration::METHOD:
          case Declaration::NAKED_ID:
          case Declaration::NAKED_ANNOTATION:
            // Not a node.  Skip.
            break;
          default:
            KJ_FAIL_ASSERT("unknown declaration type", nestedDecl);
            break;
        }
      }

      content.advanceState(Content::EXPANDED);
    } KJ_FALLTHROUGH;

    case Content::EXPANDED: {
      if (minimumState <= Content::EXPANDED) break;

      // Construct the NodeTranslator.
      auto& workspace = module->getCompiler().getWorkspace();

      auto schemaNode = workspace.orphanage.newOrphan<schema::Node>();
      auto builder = schemaNode.get();
      builder.setId(id);
      builder.setDisplayName(displayName);
      // TODO(cleanup):  Would be better if we could remember the prefix length from before we
      //   added this decl's name to the end.
      KJ_IF_SOME(lastDot, displayName.findLast('.')) {
        builder.setDisplayNamePrefixLength(lastDot + 1);
      }
      KJ_IF_SOME(lastColon, displayName.findLast(':')) {
        if (lastColon > builder.getDisplayNamePrefixLength()) {
          builder.setDisplayNamePrefixLength(lastColon + 1);
        }
      }
      KJ_IF_SOME(p, parent) {
        builder.setScopeId(p.id);
      }

      auto nestedNodes = builder.initNestedNodes(content.orderedNestedNodes.size());
      auto nestedIter = nestedNodes.begin();
      for (auto node: content.orderedNestedNodes) {
        nestedIter->setName(node->declaration.getName().getValue());
        nestedIter->setId(node->id);
        ++nestedIter;
      }

      content.translator = &workspace.arena.allocate<NodeTranslator>(
          *this, module->getErrorReporter(), declaration, kj::mv(schemaNode),
          module->getCompiler().shouldCompileAnnotations());
      KJ_IF_SOME(exception, kj::runCatchingExceptions([&](){
        auto nodeSet = content.translator->getBootstrapNode();
        for (auto& auxNode: nodeSet.auxNodes) {
          workspace.bootstrapLoader.loadOnce(auxNode);
        }
        content.bootstrapSchema = workspace.bootstrapLoader.loadOnce(nodeSet.node);
      })) {
        content.bootstrapSchema = kj::none;
        // Only bother to report validation failures if we think we haven't seen any errors.
        // Otherwise we assume that the errors caused the validation failure.
        if (!module->getErrorReporter().hadErrors()) {
          addError(kj::str("Internal compiler bug: Bootstrap schema failed validation:\n",
                           exception));
        }
      }

      // If the Workspace is destroyed, revert the node to the EXPANDED state, because the
      // NodeTranslator is no longer valid in this case.
      workspace.arena.copy(kj::defer([&content]() {
        content.bootstrapSchema = kj::none;
        if (content.state > Content::EXPANDED) {
          content.state = Content::EXPANDED;
        }
      }));

      content.advanceState(Content::BOOTSTRAP);
    } KJ_FALLTHROUGH;

    case Content::BOOTSTRAP: {
      if (minimumState <= Content::BOOTSTRAP) break;

      // Create the final schema.
      NodeTranslator::NodeSet nodeSet;
      if (content.bootstrapSchema == kj::none) {
        // Must have failed in an earlier stage.
        KJ_ASSERT(module->getErrorReporter().hadErrors());
        nodeSet = content.translator->getBootstrapNode();
      } else {
        nodeSet = content.translator->finish(
            module->getCompiler().getWorkspace().bootstrapLoader.getUnbound(id));
      }

      content.finalSchema = nodeSet.node;
      content.auxSchemas = kj::mv(nodeSet.auxNodes);
      content.sourceInfo = kj::mv(nodeSet.sourceInfo);

      content.advanceState(Content::FINISHED);
    } KJ_FALLTHROUGH;

    case Content::FINISHED:
      break;
  }

  return content;
}